

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

void __thiscall trun::Process::OnStdErrData(Process *this,string *data)

{
  ProcessCallbackInterface *pPVar1;
  string local_30 [32];
  
  pPVar1 = this->callback;
  if (pPVar1 != (ProcessCallbackInterface *)0x0) {
    std::__cxx11::string::string(local_30,data);
    (*pPVar1->_vptr_ProcessCallbackInterface[3])(pPVar1,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void Process::OnStdErrData(std::string data) {
	if (callback != NULL) {
		callback->OnStdErrData(data);
	}
}